

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_end(nk_context *ctx)

{
  nk_command_buffer *b;
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  nk_panel_type nVar7;
  nk_color c;
  nk_window *pnVar8;
  nk_panel *pnVar9;
  nk_window *pnVar10;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var11;
  undefined1 auVar12 [16];
  nk_vec2 nVar13;
  bool bVar14;
  nk_panel *pnVar15;
  int iVar16;
  nk_panel *pnVar17;
  uint *puVar18;
  long lVar19;
  nk_panel *pnVar20;
  nk_page_element *pe;
  nk_window *pnVar21;
  nk_context *in;
  nk_property_state *__s;
  nk_edit_state *__s_00;
  ulong uVar22;
  ulong uVar23;
  bool bVar24;
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  nk_rect r;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect rect_02;
  nk_rect scroll;
  nk_rect bounds;
  nk_rect bounds_00;
  nk_rect r_00;
  nk_flags state;
  nk_rect cursor;
  nk_rect empty_east;
  nk_rect empty_west;
  nk_rect local_110;
  float local_100;
  nk_flags local_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  nk_rect local_98;
  undefined1 local_88 [16];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [16];
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x492f,"void nk_end(struct nk_context *)");
  }
  pnVar8 = ctx->current;
  if (pnVar8 == (nk_window *)0x0) {
    __assert_fail("ctx->current && \"if this triggers you forgot to call `nk_begin`\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x4930,"void nk_end(struct nk_context *)");
  }
  pnVar9 = pnVar8->layout;
  if ((pnVar9 == (nk_panel *)0x0) ||
     ((pnVar9->type == NK_PANEL_WINDOW && ((pnVar8->flags & 0x2000) != 0)))) goto LAB_0012dd4a;
  b = &pnVar8->buffer;
  in = (nk_context *)0x0;
  if ((pnVar9->flags & 0x1400) == 0) {
    in = ctx;
  }
  if ((pnVar9->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == 0) {
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(b,r);
  }
  local_c8 = ZEXT416((uint)(ctx->style).window.scrollbar_size.x);
  local_d8 = ZEXT416((uint)(ctx->style).window.scrollbar_size.y);
  nVar13 = nk_panel_get_padding(&ctx->style,pnVar9->type);
  auVar12._8_4_ = extraout_XMM0_Dc;
  auVar12._0_4_ = nVar13.x;
  auVar12._4_4_ = nVar13.y;
  auVar12._12_4_ = extraout_XMM0_Dd;
  fVar25 = (pnVar9->row).height + pnVar9->at_y;
  pnVar9->at_y = fVar25;
  local_e8 = auVar12;
  if ((pnVar9->flags & 0x8800) == 0x800) {
    fVar27 = (pnVar9->bounds).y;
    if (fVar25 < (pnVar9->bounds).h + fVar27) {
      (pnVar9->bounds).h = fVar25 - fVar27;
    }
    local_e8._4_4_ = nVar13.y;
    rect.y = fVar27;
    rect.x = (pnVar8->bounds).x;
    rect.h = (float)local_e8._4_4_;
    rect.w = (pnVar8->bounds).w;
    nk_fill_rect(b,rect,0.0,(ctx->style).window.background);
    rect_00.w = pnVar9->border + (float)local_e8._0_4_;
    rect_00.y = (pnVar9->bounds).y;
    rect_00.x = (pnVar8->bounds).x;
    rect_00.h = (pnVar9->bounds).h;
    nk_fill_rect(b,rect_00,0.0,(ctx->style).window.background);
    rect_01.x = ((pnVar9->bounds).x + (pnVar9->bounds).w) - pnVar9->border;
    fVar25 = pnVar9->border + (float)local_e8._0_4_;
    if ((*pnVar9->offset_y == 0) && ((pnVar9->flags & 0x20) == 0)) {
      fVar25 = fVar25 + (float)local_c8._0_4_;
    }
    rect_01.y = (pnVar9->bounds).y;
    rect_01.h = (pnVar9->bounds).h;
    rect_01.w = fVar25;
    nk_fill_rect(b,rect_01,0.0,(ctx->style).window.background);
    if ((*pnVar9->offset_x != 0) && ((pnVar9->flags & 0x20) == 0)) {
      rect_02.y = (pnVar9->bounds).y + (pnVar9->bounds).h;
      rect_02.x = (pnVar8->bounds).x;
      rect_02.h = (float)local_d8._0_4_;
      rect_02.w = (pnVar8->bounds).w;
      nk_fill_rect(b,rect_02,0.0,(ctx->style).window.background);
    }
  }
  if (((pnVar9->flags & 0x8020) == 0) &&
     (pnVar8->scrollbar_hiding_timer <= 4.0 && pnVar8->scrollbar_hiding_timer != 4.0)) {
    if ((pnVar9->type &
        (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
        NK_PANEL_GROUP)) == 0) {
      if (pnVar8 == ctx->active) {
        bVar24 = pnVar9->has_scrolling != 0;
      }
      else {
        bVar24 = false;
      }
      if (in != (nk_context *)0x0) {
        bVar14 = bVar24;
        if ((in->input).mouse.scroll_delta.y <= 0.0) {
          bVar14 = (bool)(0.0 < (in->input).mouse.scroll_delta.x & bVar24);
        }
        if (bVar14 != false) {
          pnVar8->scrolled = 1;
          goto LAB_0012d26c;
        }
      }
      pnVar8->scrolled = 0;
    }
    else {
      pnVar17 = pnVar8->layout;
      pnVar15 = pnVar17;
      do {
        pnVar20 = pnVar15;
        pnVar15 = pnVar20->parent;
        pnVar10 = pnVar8;
      } while (pnVar20->parent != (nk_panel *)0x0);
      do {
        pnVar21 = pnVar10;
        pnVar10 = pnVar21->parent;
      } while (pnVar10 != (nk_window *)0x0);
      if (((pnVar21 != ctx->active) || (pnVar9->has_scrolling == 0)) || (in == (nk_context *)0x0))
      goto LAB_0012d128;
      uVar2 = (pnVar9->bounds).x;
      uVar4 = (pnVar9->bounds).y;
      fVar25 = (in->input).mouse.pos.x;
      bVar24 = false;
      if (((float)uVar2 <= fVar25) &&
         (uVar3 = (pnVar9->bounds).w, uVar5 = (pnVar9->bounds).h,
         fVar25 < (float)uVar2 + (float)uVar3)) {
        fVar25 = (in->input).mouse.pos.y;
        bVar24 = false;
        if (((float)uVar4 <= fVar25) && (fVar25 < (float)uVar4 + (float)uVar5)) {
          fVar25 = (pnVar20->clip).x;
          fVar27 = (pnVar9->bounds).x;
          if ((fVar25 <= (pnVar9->bounds).w + fVar27) && (fVar27 <= fVar25 + (pnVar20->clip).w)) {
            fVar25 = (pnVar20->clip).y;
            fVar27 = (pnVar9->bounds).y;
            if ((fVar25 <= (pnVar9->bounds).h + fVar27) && (fVar27 <= fVar25 + (pnVar20->clip).h)) {
              for (; pnVar17->parent != (nk_panel *)0x0; pnVar17 = pnVar17->parent) {
                pnVar17->has_scrolling = 0;
              }
              pnVar17->has_scrolling = 0;
              bVar24 = true;
              goto LAB_0012d26c;
            }
          }
LAB_0012d128:
          bVar24 = false;
        }
      }
    }
LAB_0012d26c:
    local_110.x = 0.0;
    fVar25 = (pnVar9->bounds).y;
    fVar27 = (pnVar9->bounds).h;
    scroll.x = (pnVar9->bounds).x + (pnVar9->bounds).w + (float)local_e8._0_4_;
    scroll.y = fVar25;
    scroll.h = fVar27;
    scroll.w = (float)local_c8._0_4_;
    fVar25 = nk_do_scrollbarv((nk_flags *)&local_110,b,scroll,(uint)bVar24,(float)*pnVar9->offset_y,
                              (float)(int)(pnVar9->at_y - fVar25),fVar27 * 0.1,fVar27 * 0.01,
                              &(ctx->style).scrollv,&in->input,(ctx->style).font);
    *pnVar9->offset_y = (nk_uint)(long)fVar25;
    if ((in != (nk_context *)0x0) && (bVar24 != false)) {
      (in->input).mouse.scroll_delta.y = 0.0;
    }
    local_fc = 0;
    local_110.y = (pnVar9->bounds).y + (pnVar9->bounds).h;
    fVar25 = (pnVar9->bounds).x;
    fVar27 = pnVar9->max_x;
    fVar28 = (pnVar9->bounds).w;
    fVar26 = (float)(int)(fVar27 - fVar25);
    font = (ctx->style).font;
    local_110.h = 1.0;
    if (1.0 <= (float)local_d8._0_4_) {
      local_110.h = (float)local_d8._0_4_;
    }
    fVar30 = local_110.h + local_110.h;
    local_110.w = fVar30;
    if (fVar30 <= fVar28) {
      local_110.w = fVar28;
    }
    fVar28 = 0.0;
    local_110.x = fVar25;
    if (local_110.w < fVar26) {
      fVar29 = (float)*pnVar9->offset_x;
      fVar28 = fVar27 * 0.05;
      local_f8 = ZEXT416((uint)fVar26);
      local_50.h = local_110.h;
      if ((ctx->style).scrollh.show_buttons != 0) {
        local_a8 = ZEXT416((uint)fVar30);
        local_68 = ZEXT416((uint)local_110.w);
        local_100 = fVar28;
        if (fVar27 * 0.005 <= fVar28) {
          local_100 = fVar27 * 0.005;
        }
        bounds.y = local_110.y;
        bounds.x = fVar25;
        local_88 = ZEXT416((uint)local_110.y);
        local_b8 = ZEXT416((uint)local_110.h);
        bounds.h = local_110.h;
        bounds.w = local_110.h;
        local_78 = local_110.h;
        fStack_74 = local_110.h;
        fStack_70 = local_110.h;
        fStack_6c = local_110.h;
        iVar16 = nk_do_button_symbol((nk_flags *)&local_98,b,bounds,(ctx->style).scrollh.dec_symbol,
                                     NK_BUTTON_REPEATER,&(ctx->style).scrollh.dec_button,&in->input,
                                     font);
        fVar27 = 0.0;
        if (iVar16 != 0) {
          fVar27 = local_100;
        }
        local_a8._4_4_ = local_68._4_4_;
        local_a8._0_4_ = (float)local_68._0_4_ - (float)local_a8._0_4_;
        local_a8._8_4_ = local_68._8_4_;
        local_a8._12_4_ = local_68._12_4_;
        fVar29 = fVar29 - fVar27;
        bounds_00.x = ((float)local_68._0_4_ + fVar25) - (float)local_b8._0_4_;
        bounds_00.h = fStack_74;
        bounds_00.w = local_78;
        bounds_00.y = (float)local_88._0_4_;
        iVar16 = nk_do_button_symbol((nk_flags *)&local_98,b,bounds_00,
                                     (ctx->style).scrollh.inc_symbol,NK_BUTTON_REPEATER,
                                     &(ctx->style).scrollh.inc_button,&in->input,font);
        if (iVar16 != 0) {
          fVar29 = fVar29 + local_100;
        }
        local_110.x = fVar25 + (float)local_b8._0_4_;
        local_110.w = (float)local_a8._0_4_;
        fVar26 = (float)local_f8._0_4_;
        local_50.h = (float)local_b8._0_4_;
      }
      fVar27 = local_110.w;
      fVar25 = local_110.x;
      if (local_110.w <= fVar28) {
        fVar28 = local_110.w;
      }
      if (fVar26 - local_110.w <= fVar29) {
        fVar29 = fVar26 - local_110.w;
      }
      fVar30 = 0.0;
      if (0.0 <= fVar29) {
        fVar30 = fVar29;
      }
      fVar29 = (ctx->style).scrollh.border;
      fVar1 = (ctx->style).scrollh.padding.x;
      local_98.x = (fVar30 / fVar26) * local_110.w + local_110.x + fVar29 + fVar1;
      local_98.w = (local_110.w / fVar26) * local_110.w - (fVar1 + fVar1 + fVar29 + fVar29);
      fVar1 = (ctx->style).scrollh.padding.y;
      local_98.y = fVar29 + local_110.y + fVar1;
      local_98.h = local_50.h - (fVar1 + fVar1 + fVar29 + fVar29);
      local_40.x = local_110.x;
      local_40.y = local_110.y;
      local_50.x = local_98.w + local_98.x;
      local_40.w = local_98.x - local_110.x;
      local_50.y = local_110.y;
      local_50.w = (local_110.w + local_110.x) - local_50.x;
      local_40.h = local_50.h;
      fVar28 = nk_scrollbar_behavior
                         (&local_fc,&in->input,(uint)bVar24,&local_110,&local_98,&local_40,&local_50
                          ,fVar30,fVar26,fVar28,NK_HORIZONTAL);
      local_b8._0_4_ = fVar28;
      local_98.x = (fVar28 / (float)local_f8._0_4_) * fVar27 + fVar25;
      p_Var11 = (ctx->style).scrollh.draw_begin;
      if (p_Var11 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var11)(b,(ctx->style).scrollh.userdata);
      }
      nk_draw_scrollbar(b,local_fc,&(ctx->style).scrollh,&local_110,&local_98);
      p_Var11 = (ctx->style).scrollh.draw_end;
      if (p_Var11 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
        (*p_Var11)(b,(ctx->style).scrollh.userdata);
      }
      fVar28 = (float)local_b8._0_4_;
    }
    *pnVar9->offset_x = (nk_uint)(long)fVar28;
  }
  if ((pnVar8->flags & 0x80) == 0) {
LAB_0012d711:
    pnVar8->scrollbar_hiding_timer = 0.0;
  }
  else {
    fVar25 = (ctx->input).mouse.delta.x;
    if ((((fVar25 != 0.0) || (NAN(fVar25))) || (fVar25 = (ctx->input).mouse.delta.y, fVar25 != 0.0))
       || (NAN(fVar25))) {
      bVar24 = false;
    }
    else {
      bVar24 = (ctx->input).mouse.scroll_delta.y == 0.0;
    }
    iVar16 = nk_window_is_hovered(ctx);
    if ((!(bool)(bVar24 & iVar16 != 0)) && (iVar16 != 0 || (ctx->last_widget_state & 2) != 0))
    goto LAB_0012d711;
    pnVar8->scrollbar_hiding_timer = ctx->delta_time_seconds + pnVar8->scrollbar_hiding_timer;
  }
  uVar6 = pnVar9->flags;
  if ((uVar6 & 1) != 0) {
    nVar7 = pnVar9->type;
    lVar19 = 0x1e2c;
    if ((int)nVar7 < 0x20) {
      if (nVar7 == NK_PANEL_GROUP) {
        lVar19 = 0x1e40;
      }
      else if (nVar7 == NK_PANEL_POPUP) {
        lVar19 = 0x1e30;
      }
      else if (nVar7 == NK_PANEL_CONTEXTUAL) {
        lVar19 = 0x1e38;
      }
    }
    else if (nVar7 == NK_PANEL_COMBO) {
      lVar19 = 0x1e34;
    }
    else if ((nVar7 == NK_PANEL_MENU) || (nVar7 == NK_PANEL_TOOLTIP)) {
      lVar19 = 0x1e3c;
    }
    c = *(nk_color *)((long)&(ctx->input).keyboard.keys[0].down + lVar19);
    if ((short)uVar6 < 0) {
      fVar25 = (ctx->style).window.border + (pnVar8->bounds).y + pnVar9->header_height;
    }
    else if ((uVar6 >> 0xb & 1) == 0) {
      fVar25 = (pnVar8->bounds).y + (pnVar8->bounds).h;
    }
    else {
      fVar25 = (pnVar9->bounds).y + (pnVar9->bounds).h + pnVar9->footer_height;
    }
    local_f8._0_4_ = fVar25;
    fVar25 = (pnVar8->bounds).x;
    fVar27 = (pnVar8->bounds).y;
    nk_stroke_line(b,fVar25,fVar27,(pnVar8->bounds).w + fVar25,fVar27,pnVar9->border,c);
    fVar25 = (pnVar8->bounds).x;
    nk_stroke_line(b,fVar25,(float)local_f8._0_4_,(pnVar8->bounds).w + fVar25,(float)local_f8._0_4_,
                   pnVar9->border,c);
    fVar25 = pnVar9->border * 0.5 + (pnVar8->bounds).x;
    nk_stroke_line(b,fVar25,(pnVar8->bounds).y,fVar25,(float)local_f8._0_4_,pnVar9->border,c);
    fVar25 = ((pnVar8->bounds).x + (pnVar8->bounds).w) - pnVar9->border * 0.5;
    nk_stroke_line(b,fVar25,(pnVar8->bounds).y,fVar25,(float)local_f8._0_4_,pnVar9->border,c);
  }
  if ((in != (nk_context *)0x0) && (uVar6 = pnVar9->flags, (uVar6 & 0x8004) == 4)) {
    fVar25 = (pnVar9->bounds).x;
    fVar27 = (pnVar9->bounds).y + (pnVar9->bounds).h;
    if ((uVar6 >> 9 & 1) == 0) {
      local_e8._0_4_ = fVar25 + (pnVar9->bounds).w + (float)local_e8._0_4_;
    }
    else {
      local_e8._0_4_ = fVar25 + (float)local_e8._0_4_ * -0.5;
    }
    if ((uVar6 & 0x20) != 0) {
      local_e8._0_4_ = (float)local_e8._0_4_ - (float)local_c8._0_4_;
    }
    local_e8._4_4_ = fVar27;
    local_e8._8_8_ = 0;
    if ((ctx->style).window.scaler.type == NK_STYLE_ITEM_IMAGE) {
      r_00.y = fVar27;
      r_00.x = (float)local_e8._0_4_;
      r_00.h = (float)local_d8._0_4_;
      r_00.w = (float)local_c8._0_4_;
      nk_draw_image(b,r_00,&(ctx->style).window.scaler.data.image,(nk_color)0xffffffff);
    }
    else {
      fVar28 = (float)local_c8._0_4_ + (float)local_e8._0_4_;
      fVar25 = (float)local_e8._0_4_;
      if ((uVar6 >> 9 & 1) == 0) {
        fVar25 = fVar28;
        fVar28 = (float)local_e8._0_4_;
      }
      nk_fill_triangle(b,fVar25,fVar27,fVar25,fVar27 + (float)local_d8._0_4_,fVar28,
                       fVar27 + (float)local_d8._0_4_,(ctx->style).window.scaler.data.color);
    }
    if ((pnVar8->flags & 0x1000) == 0) {
      iVar16 = (in->input).mouse.buttons[0].down;
      fVar25 = (in->input).mouse.buttons[0].clicked_pos.x;
      bVar24 = false;
      if (((float)local_e8._0_4_ <= fVar25) &&
         (bVar24 = false, fVar25 < (float)local_c8._0_4_ + (float)local_e8._0_4_)) {
        fVar25 = (in->input).mouse.buttons[0].clicked_pos.y;
        bVar24 = iVar16 == 1 &&
                 (fVar25 < (float)local_d8._0_4_ + (float)local_e8._4_4_ &&
                 (float)local_e8._4_4_ <= fVar25);
      }
      if ((iVar16 != 0) && (bVar24)) {
        fVar25 = (ctx->style).window.min_size.x;
        fVar27 = (ctx->style).window.min_size.y;
        fVar28 = (in->input).mouse.delta.x;
        uVar6 = pnVar9->flags;
        fVar26 = fVar28;
        if ((uVar6 >> 9 & 1) != 0) {
          fVar26 = -fVar28;
          (pnVar8->bounds).x = (pnVar8->bounds).x + fVar28;
        }
        fVar29 = (pnVar8->bounds).w + fVar26;
        fVar30 = (float)local_e8._0_4_;
        if ((fVar25 <= fVar29) &&
           ((fVar26 < 0.0 || ((0.0 < fVar26 && ((float)local_e8._0_4_ <= (in->input).mouse.pos.x))))
           )) {
          (pnVar8->bounds).w = fVar29;
          fVar30 = fVar28 + (float)local_e8._0_4_;
        }
        fVar25 = (float)local_e8._4_4_;
        if ((uVar6 >> 0xb & 1) == 0) {
          fVar28 = (in->input).mouse.delta.y;
          fVar26 = (pnVar8->bounds).h + fVar28;
          if ((fVar27 < fVar26) &&
             ((fVar28 < 0.0 ||
              ((0.0 < fVar28 && ((float)local_e8._4_4_ <= (in->input).mouse.pos.y)))))) {
            (pnVar8->bounds).h = fVar26;
            fVar25 = (float)local_e8._4_4_ + fVar28;
          }
        }
        (ctx->style).cursor_active = (ctx->style).cursors[6];
        (in->input).mouse.buttons[0].clicked_pos.x = (float)local_c8._0_4_ * 0.5 + fVar30;
        (in->input).mouse.buttons[0].clicked_pos.y = (float)local_d8._0_4_ * 0.5 + fVar25;
      }
    }
  }
  if ((pnVar9->type &
      (NK_PANEL_TOOLTIP|NK_PANEL_MENU|NK_PANEL_COMBO|NK_PANEL_CONTEXTUAL|NK_PANEL_POPUP|
      NK_PANEL_GROUP)) == 0) {
    if ((pnVar9->flags & 0x2000) == 0) {
      (pnVar8->buffer).end = (ctx->memory).allocated;
      if ((pnVar8->popup).buf.active != 0) {
        *(nk_size *)((long)(ctx->memory).memory.ptr + (pnVar8->popup).buf.parent + 8) =
             (pnVar8->popup).buf.end;
      }
    }
    else {
      (pnVar8->buffer).begin = 0;
      (pnVar8->buffer).end = 0;
      (pnVar8->buffer).last = 0;
      (pnVar8->buffer).clip = nk_null_rect;
    }
  }
  if ((pnVar9->flags >> 0x10 & 1) != 0) {
    pnVar9->flags = pnVar9->flags & 0xfffeefff;
  }
  pnVar8->flags = pnVar9->flags;
  iVar16 = (pnVar8->property).active;
  if (((iVar16 == 0) || ((pnVar8->property).old == (pnVar8->property).seq)) ||
     (iVar16 != (pnVar8->property).prev)) {
    (pnVar8->property).old = (pnVar8->property).seq;
    (pnVar8->property).prev = iVar16;
    (pnVar8->property).seq = 0;
  }
  else {
    __s = &pnVar8->property;
    uVar22 = (ulong)__s & 3;
    if (uVar22 == 0) {
      uVar23 = 0x68;
    }
    else {
      memset(__s,0,4 - uVar22);
      uVar23 = uVar22 | 100;
      __s = (nk_property_state *)((long)__s + (4 - uVar22));
    }
    uVar22 = (ulong)((uint)uVar23 & 0xfffffffc);
    memset(__s,0,uVar22);
    if ((uVar23 & 3) != 0) {
      memset(__s->buffer + (uVar22 - 8),0,uVar23 & 3);
    }
  }
  iVar16 = (pnVar8->edit).active;
  if (((iVar16 == 0) || ((pnVar8->edit).old == (pnVar8->edit).seq)) ||
     (iVar16 != (pnVar8->edit).prev)) {
    (pnVar8->edit).old = (pnVar8->edit).seq;
    (pnVar8->edit).prev = iVar16;
    (pnVar8->edit).seq = 0;
  }
  else {
    __s_00 = &pnVar8->edit;
    uVar22 = (ulong)__s_00 & 3;
    if (uVar22 == 0) {
      uVar23 = 0x2c;
    }
    else {
      memset(__s_00,0,4 - uVar22);
      uVar23 = uVar22 | 0x28;
      __s_00 = (nk_edit_state *)((long)__s_00 + (4 - uVar22));
    }
    uVar22 = (ulong)((uint)uVar23 & 0xfffffffc);
    memset(__s_00,0,uVar22);
    if ((uVar23 & 3) != 0) {
      memset((void *)((long)&__s_00->name + uVar22),0,uVar23 & 3);
    }
  }
  if (((pnVar8->popup).active_con == 0) || ((pnVar8->popup).con_old == (pnVar8->popup).con_count)) {
    puVar18 = &(pnVar8->popup).con_count;
    (pnVar8->popup).con_old = (pnVar8->popup).con_count;
  }
  else {
    puVar18 = &(pnVar8->popup).active_con;
    (pnVar8->popup).con_count = 0;
    (pnVar8->popup).con_old = 0;
  }
  *puVar18 = 0;
  (pnVar8->popup).combo_count = 0;
  if ((pnVar9->row).tree_depth != 0) {
    __assert_fail("!layout->row.tree_depth",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x474a,"void nk_panel_end(struct nk_context *)");
  }
  nk_free_page_element(ctx,(nk_page_element *)ctx->current->layout);
LAB_0012dd4a:
  ctx->current = (nk_window *)0x0;
  return;
}

Assistant:

NK_API void
nk_end(struct nk_context *ctx)
{
    struct nk_panel *layout;
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current && "if this triggers you forgot to call `nk_begin`");
    if (!ctx || !ctx->current)
        return;

    layout = ctx->current->layout;
    if (!layout || (layout->type == NK_PANEL_WINDOW && (ctx->current->flags & NK_WINDOW_HIDDEN))) {
        ctx->current = 0;
        return;
    }
    nk_panel_end(ctx);
    nk_free_panel(ctx, ctx->current->layout);
    ctx->current = 0;
}